

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O2

void GPU_SetRendererOrder(int order_size,GPU_RendererID *order)

{
  int count;
  GPU_RendererID default_order [10];
  
  if (order == (GPU_RendererID *)0x0) {
    count = 0;
    GPU_GetDefaultRendererOrder(&count,default_order);
    GPU_SetRendererOrder(count,default_order);
  }
  else if (0 < order_size) {
    if (10 < (uint)order_size) {
      GPU_PushErrorCode("GPU_SetRendererOrder",GPU_ERROR_USER_ERROR,
                        "Given order_size (%d) is greater than GPU_RENDERER_ORDER_MAX (%d)",
                        order_size,10);
      order_size = 10;
    }
    memcpy(_gpu_renderer_order,order,(ulong)(uint)(order_size * 0x18));
    _gpu_renderer_order_size = order_size;
  }
  return;
}

Assistant:

void GPU_SetRendererOrder(int order_size, GPU_RendererID* order)
{
    if(order == NULL)
    {
        // Restore the default order
        int count = 0;
        GPU_RendererID default_order[GPU_RENDERER_ORDER_MAX];
        GPU_GetDefaultRendererOrder(&count, default_order);
        GPU_SetRendererOrder(count, default_order);  // Call us again with the default order
        return;
    }
    
    if(order_size <= 0)
        return;
    
    if(order_size > GPU_RENDERER_ORDER_MAX)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Given order_size (%d) is greater than GPU_RENDERER_ORDER_MAX (%d)", order_size, GPU_RENDERER_ORDER_MAX);
        order_size = GPU_RENDERER_ORDER_MAX;
    }
    
    memcpy(_gpu_renderer_order, order, order_size*sizeof(GPU_RendererID));
    _gpu_renderer_order_size = order_size;
}